

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knownhost.c
# Opt level: O0

int knownhost_add(LIBSSH2_KNOWNHOSTS *hosts,char *host,char *salt,char *key_type_name,
                 size_t key_type_len,char *key,size_t keylen,char *comment,size_t commentlen,
                 int typemask,libssh2_knownhost **store)

{
  short sVar1;
  LIBSSH2_SESSION *session;
  char *src;
  int iVar2;
  undefined8 uVar3;
  size_t src_len;
  size_t sVar4;
  libssh2_knownhost *plVar5;
  size_t nlen;
  size_t ptrlen;
  char *ptr;
  size_t sStack_50;
  int rc;
  size_t hostlen;
  known_host *entry;
  char *key_local;
  size_t key_type_len_local;
  char *key_type_name_local;
  char *salt_local;
  char *host_local;
  LIBSSH2_KNOWNHOSTS *hosts_local;
  
  entry = (known_host *)key;
  key_local = (char *)key_type_len;
  key_type_len_local = (size_t)key_type_name;
  key_type_name_local = salt;
  salt_local = host;
  host_local = (char *)hosts;
  sStack_50 = strlen(host);
  if ((typemask & 0x3c0000U) == 0) {
    iVar2 = _libssh2_error(*(LIBSSH2_SESSION **)host_local,-0x22,"No key type set");
    return iVar2;
  }
  hostlen = (size_t)_libssh2_calloc(*(LIBSSH2_SESSION **)host_local,0x90);
  if ((void *)hostlen == (void *)0x0) {
    iVar2 = _libssh2_error(*(LIBSSH2_SESSION **)host_local,-6,
                           "Unable to allocate memory for known host entry");
    return iVar2;
  }
  *(int *)(hostlen + 0x2c) = typemask;
  sVar1 = *(short *)(hostlen + 0x2c);
  if (sVar1 == 1) {
LAB_0011f064:
    uVar3 = (**(code **)(*(long *)host_local + 8))(sStack_50 + 1,*(undefined8 *)host_local);
    *(undefined8 *)(hostlen + 0x18) = uVar3;
    if (*(long *)(hostlen + 0x18) == 0) {
      ptr._4_4_ = _libssh2_error(*(LIBSSH2_SESSION **)host_local,-6,
                                 "Unable to allocate memory for host name");
      goto LAB_0011f428;
    }
    memcpy(*(void **)(hostlen + 0x18),salt_local,sStack_50 + 1);
    *(size_t *)(hostlen + 0x20) = sStack_50;
  }
  else {
    if (sVar1 != 2) {
      if (sVar1 != 3) {
        ptr._4_4_ = _libssh2_error(*(LIBSSH2_SESSION **)host_local,-0x21,"Unknown host name type");
        goto LAB_0011f428;
      }
      goto LAB_0011f064;
    }
    ptr._4_4_ = _libssh2_base64_decode
                          (*(LIBSSH2_SESSION **)host_local,(char **)&ptrlen,&nlen,salt_local,
                           sStack_50);
    src = key_type_name_local;
    if (ptr._4_4_ != 0) goto LAB_0011f428;
    if (key_type_name_local == (char *)0x0) {
      ptr._4_4_ = _libssh2_error(*(LIBSSH2_SESSION **)host_local,-0x22,"Salt is NULL");
      goto LAB_0011f428;
    }
    *(size_t *)(hostlen + 0x18) = ptrlen;
    *(size_t *)(hostlen + 0x20) = nlen;
    session = *(LIBSSH2_SESSION **)host_local;
    src_len = strlen(key_type_name_local);
    ptr._4_4_ = _libssh2_base64_decode(session,(char **)&ptrlen,&nlen,src,src_len);
    if (ptr._4_4_ != 0) goto LAB_0011f428;
    *(size_t *)(hostlen + 0x30) = ptrlen;
    *(size_t *)(hostlen + 0x38) = nlen;
    ptr._4_4_ = 0;
  }
  if ((typemask & 0x20000U) == 0) {
    sVar4 = _libssh2_base64_encode
                      (*(LIBSSH2_SESSION **)host_local,(char *)entry,keylen,(char **)&ptrlen);
    if (sVar4 == 0) {
      ptr._4_4_ = _libssh2_error(*(LIBSSH2_SESSION **)host_local,-6,
                                 "Unable to allocate memory for base64-encoded key");
      goto LAB_0011f428;
    }
    *(size_t *)(hostlen + 0x40) = ptrlen;
  }
  else {
    if (keylen == 0) {
      keylen = strlen((char *)entry);
    }
    uVar3 = (**(code **)(*(long *)host_local + 8))(keylen + 1,*(undefined8 *)host_local);
    *(undefined8 *)(hostlen + 0x40) = uVar3;
    if (*(long *)(hostlen + 0x40) == 0) {
      ptr._4_4_ = _libssh2_error(*(LIBSSH2_SESSION **)host_local,-6,
                                 "Unable to allocate memory for key");
      goto LAB_0011f428;
    }
    memcpy(*(void **)(hostlen + 0x40),entry,keylen + 1);
    *(undefined1 *)(*(long *)(hostlen + 0x40) + keylen) = 0;
  }
  if ((key_type_len_local != 0) && ((typemask & 0x3c0000U) == 0x3c0000)) {
    uVar3 = (**(code **)(*(long *)host_local + 8))(key_local + 1,*(undefined8 *)host_local);
    *(undefined8 *)(hostlen + 0x48) = uVar3;
    if (*(long *)(hostlen + 0x48) == 0) {
      ptr._4_4_ = _libssh2_error(*(LIBSSH2_SESSION **)host_local,-6,
                                 "Unable to allocate memory for key type");
      goto LAB_0011f428;
    }
    memcpy(*(void **)(hostlen + 0x48),(void *)key_type_len_local,(size_t)key_local);
    key_local[*(long *)(hostlen + 0x48)] = '\0';
    *(char **)(hostlen + 0x50) = key_local;
  }
  if (comment == (char *)0x0) {
    *(undefined8 *)(hostlen + 0x58) = 0;
  }
  else {
    uVar3 = (**(code **)(*(long *)host_local + 8))(commentlen + 1,*(undefined8 *)host_local);
    *(undefined8 *)(hostlen + 0x58) = uVar3;
    if (*(long *)(hostlen + 0x58) == 0) {
      ptr._4_4_ = _libssh2_error(*(LIBSSH2_SESSION **)host_local,-6,
                                 "Unable to allocate memory for comment");
LAB_0011f428:
      free_host(*(LIBSSH2_SESSION **)host_local,(known_host *)hostlen);
      return ptr._4_4_;
    }
    memcpy(*(void **)(hostlen + 0x58),comment,commentlen + 1);
    *(undefined1 *)(*(long *)(hostlen + 0x58) + commentlen) = 0;
    *(size_t *)(hostlen + 0x60) = commentlen;
  }
  _libssh2_list_add((list_head *)(host_local + 8),(list_node *)hostlen);
  if (store != (libssh2_knownhost **)0x0) {
    plVar5 = knownhost_to_external((known_host *)hostlen);
    *store = plVar5;
  }
  return 0;
}

Assistant:

static int
knownhost_add(LIBSSH2_KNOWNHOSTS *hosts,
              const char *host, const char *salt,
              const char *key_type_name, size_t key_type_len,
              const char *key, size_t keylen,
              const char *comment, size_t commentlen,
              int typemask, struct libssh2_knownhost **store)
{
    struct known_host *entry;
    size_t hostlen = strlen(host);
    int rc;
    char *ptr;
    size_t ptrlen;

    /* make sure we have a key type set */
    if(!(typemask & LIBSSH2_KNOWNHOST_KEY_MASK))
        return _libssh2_error(hosts->session, LIBSSH2_ERROR_INVAL,
                              "No key type set");

    entry = LIBSSH2_CALLOC(hosts->session, sizeof(struct known_host));
    if(!entry)
        return _libssh2_error(hosts->session, LIBSSH2_ERROR_ALLOC,
                              "Unable to allocate memory for known host "
                              "entry");

    entry->typemask = typemask;

    switch(entry->typemask  & LIBSSH2_KNOWNHOST_TYPE_MASK) {
    case LIBSSH2_KNOWNHOST_TYPE_PLAIN:
    case LIBSSH2_KNOWNHOST_TYPE_CUSTOM:
        entry->name = LIBSSH2_ALLOC(hosts->session, hostlen + 1);
        if(!entry->name) {
            rc = _libssh2_error(hosts->session, LIBSSH2_ERROR_ALLOC,
                                "Unable to allocate memory for host name");
            goto error;
        }
        memcpy(entry->name, host, hostlen + 1);
        entry->name_len = hostlen;
        break;
    case LIBSSH2_KNOWNHOST_TYPE_SHA1:
        rc = _libssh2_base64_decode(hosts->session, &ptr, &ptrlen,
                                    host, hostlen);
        if(rc)
            goto error;

        if(!salt) {
            rc = _libssh2_error(hosts->session, LIBSSH2_ERROR_INVAL,
                                "Salt is NULL");
            goto error;
        }

        entry->name = ptr;
        entry->name_len = ptrlen;

        rc = _libssh2_base64_decode(hosts->session, &ptr, &ptrlen,
                                    salt, strlen(salt));
        if(rc)
            goto error;
        entry->salt = ptr;
        entry->salt_len = ptrlen;
        break;
    default:
        rc = _libssh2_error(hosts->session, LIBSSH2_ERROR_METHOD_NOT_SUPPORTED,
                            "Unknown host name type");
        goto error;
    }

    if(typemask & LIBSSH2_KNOWNHOST_KEYENC_BASE64) {
        /* the provided key is base64 encoded already */
        if(!keylen)
            keylen = strlen(key);
        entry->key = LIBSSH2_ALLOC(hosts->session, keylen + 1);
        if(!entry->key) {
            rc = _libssh2_error(hosts->session, LIBSSH2_ERROR_ALLOC,
                                "Unable to allocate memory for key");
            goto error;
        }
        memcpy(entry->key, key, keylen + 1);
        entry->key[keylen] = 0; /* force a terminating zero trailer */
    }
    else {
        /* key is raw, we base64 encode it and store it as such */
        size_t nlen = _libssh2_base64_encode(hosts->session, key, keylen,
                                             &ptr);
        if(!nlen) {
            rc = _libssh2_error(hosts->session, LIBSSH2_ERROR_ALLOC,
                                "Unable to allocate memory for "
                                "base64-encoded key");
            goto error;
        }

        entry->key = ptr;
    }

    if(key_type_name && ((typemask & LIBSSH2_KNOWNHOST_KEY_MASK) ==
                          LIBSSH2_KNOWNHOST_KEY_UNKNOWN)) {
        entry->key_type_name = LIBSSH2_ALLOC(hosts->session, key_type_len + 1);
        if(!entry->key_type_name) {
            rc = _libssh2_error(hosts->session, LIBSSH2_ERROR_ALLOC,
                                "Unable to allocate memory for key type");
            goto error;
        }
        memcpy(entry->key_type_name, key_type_name, key_type_len);
        entry->key_type_name[key_type_len] = 0;
        entry->key_type_len = key_type_len;
    }

    if(comment) {
        entry->comment = LIBSSH2_ALLOC(hosts->session, commentlen + 1);
        if(!entry->comment) {
            rc = _libssh2_error(hosts->session, LIBSSH2_ERROR_ALLOC,
                                "Unable to allocate memory for comment");
            goto error;
        }
        memcpy(entry->comment, comment, commentlen + 1);
        entry->comment[commentlen] = 0; /* force a terminating zero trailer */
        entry->comment_len = commentlen;
    }
    else {
        entry->comment = NULL;
    }

    /* add this new host to the big list of known hosts */
    _libssh2_list_add(&hosts->head, &entry->node);

    if(store)
        *store = knownhost_to_external(entry);

    return LIBSSH2_ERROR_NONE;
error:
    free_host(hosts->session, entry);
    return rc;
}